

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

Llb_Grp_t * Llb_ManGroupCreateFromCuts(Llb_Man_t *pMan,Vec_Int_t *vCut1,Vec_Int_t *vCut2)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Llb_Grp_t *pGroup;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Llb_Grp_t *p;
  Vec_Int_t *vCut2_local;
  Vec_Int_t *vCut1_local;
  Llb_Man_t *pMan_local;
  
  pGroup = Llb_ManGroupAlloc(pMan);
  Aig_ManIncrementTravId(pMan->pAig);
  for (local_34 = 0; iVar2 = Vec_IntSize(vCut1), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut1,local_34);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    Aig_ObjSetTravIdCurrent(pMan->pAig,pAVar3);
  }
  for (local_34 = 0; iVar2 = Vec_IntSize(vCut2), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut2,local_34);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    iVar2 = Aig_ObjIsTravIdCurrent(pMan->pAig,pAVar3);
    if (iVar2 == 0) {
      Vec_PtrPush(pGroup->vOuts,pAVar3);
    }
  }
  Aig_ManIncrementTravId(pMan->pAig);
  for (local_34 = 0; iVar2 = Vec_IntSize(vCut2), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut2,local_34);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    Llb_ManGroupMarkNodes_rec(pMan->pAig,pAVar3);
  }
  for (local_34 = 0; iVar2 = Vec_IntSize(vCut1), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar1 = pMan->pAig;
    iVar2 = Vec_IntEntry(vCut1,local_34);
    pAVar3 = Aig_ManObj(pAVar1,iVar2);
    iVar2 = Aig_ObjIsTravIdCurrent(pMan->pAig,pAVar3);
    if (iVar2 != 0) {
      Vec_PtrPush(pGroup->vIns,pAVar3);
    }
  }
  if (pGroup->vNodes != (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vNodes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Group.c"
                  ,0x152,
                  "Llb_Grp_t *Llb_ManGroupCreateFromCuts(Llb_Man_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  pVVar4 = Llb_ManGroupCollect(pGroup);
  pGroup->vNodes = pVVar4;
  return pGroup;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFromCuts( Llb_Man_t * pMan, Vec_Int_t * vCut1, Vec_Int_t * vCut2 )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );

    // mark Cut1
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        Aig_ObjSetTravIdCurrent( pMan->pAig, pObj );
    // collect unmarked Cut2
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        if ( !Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vOuts, pObj );

    // mark nodes reachable from Cut2
    Aig_ManIncrementTravId( pMan->pAig );
    Aig_ManForEachObjVec( vCut2, pMan->pAig, pObj, i )
        Llb_ManGroupMarkNodes_rec( pMan->pAig, pObj );
    // collect marked Cut1
    Aig_ManForEachObjVec( vCut1, pMan->pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent( pMan->pAig, pObj ) )
            Vec_PtrPush( p->vIns, pObj );

    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}